

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdClearWitnessStack(void *handle,void *create_handle,char *txid,uint32_t vout)

{
  Transaction *this;
  ConfidentialTransaction *this_00;
  bool bVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  string *message;
  uint in_ECX;
  CfdException *in_RDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  uint32_t index_1;
  ConfidentialTransactionContext *tx_1;
  uint32_t index;
  TransactionContext *tx;
  bool is_bitcoin;
  Txid txid_obj;
  CfdCapiTransactionData *tx_data;
  int result;
  string *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffe80;
  bool *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec4;
  allocator local_111;
  string local_110 [38];
  byte local_ea;
  allocator local_e9;
  string local_e8;
  Txid local_c8;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [8];
  string *in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  CfdSourceLocation local_80;
  long local_68;
  allocator local_59;
  string local_58 [48];
  undefined4 local_28;
  uint local_24;
  CfdException *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  local_28 = 0xffffffff;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"TransactionData",&local_59);
  cfd::capi::CheckBuffer(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_68 = local_18;
  bVar1 = cfd::capi::IsEmptyString((char *)local_20);
  if (bVar1) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0x2ba;
    local_80.funcname = "CfdClearWitnessStack";
    cfd::core::logger::warn<>(&local_80,"txid is null or empty.");
    local_a2 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"Failed to parameter. txid is null or empty.",&local_a1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe80,error_code,in_stack_fffffffffffffe70);
    local_a2 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,(char *)local_20,&local_e9);
  cfd::core::Txid::Txid(&local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  local_ea = 0;
  cfd::capi::ConvertNetType(in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8);
  if (*(long *)(local_68 + 0x18) == 0) {
    message = (string *)__cxa_allocate_exception(0x30);
    paVar4 = &local_111;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"Invalid handle state. tx is null",paVar4);
    cfd::core::CfdException::CfdException(local_20,(CfdError)((ulong)paVar4 >> 0x20),message);
    __cxa_throw(message,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_ea & 1) == 0) {
    this_00 = *(ConfidentialTransaction **)(local_68 + 0x18);
    uVar2 = (*(this_00->super_AbstractTransaction)._vptr_AbstractTransaction[2])
                      (this_00,&local_c8,(ulong)local_24);
    cfd::core::ConfidentialTransaction::RemoveScriptWitnessStackAll(this_00,uVar2);
  }
  else {
    this = *(Transaction **)(local_68 + 0x18);
    uVar2 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[2])
                      (this,&local_c8,(ulong)local_24);
    cfd::core::Transaction::RemoveScriptWitnessStackAll(this,uVar2);
  }
  local_4 = 0;
  cfd::core::Txid::~Txid((Txid *)0x60b2bf);
  return local_4;
}

Assistant:

int CfdClearWitnessStack(
    void* handle, void* create_handle, const char* txid, uint32_t vout) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    Txid txid_obj(txid);
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      auto index = tx->GetTxInIndex(txid_obj, vout);
      tx->RemoveScriptWitnessStackAll(index);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      auto index = tx->GetTxInIndex(txid_obj, vout);
      tx->RemoveScriptWitnessStackAll(index);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}